

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memplumber.cpp
# Opt level: O3

void __thiscall
MemPlumberInternal::freeMemory(MemPlumberInternal *this,void *pointer,char *file,int line)

{
  long *plVar1;
  long *plVar2;
  long *__ptr;
  long *plVar3;
  
  if (pointer == (void *)0x0) {
    return;
  }
  plVar2 = (long *)((long)this->m_PointerListHashtable +
                   (ulong)((uint)((ulong)pointer >> 5) & 0x1fff8));
  __ptr = plVar2;
  plVar1 = (long *)0x0;
  do {
    plVar3 = plVar1;
    __ptr = (long *)*__ptr;
    if (__ptr == (long *)0x0) {
      __ptr = (long *)pointer;
      if (((FILE *)this->m_Dumper != (FILE *)0x0 & this->m_Verbose) == 1) {
        fprintf((FILE *)this->m_Dumper,"Pointer 0x%p wasn\'t found\n",pointer);
      }
      goto LAB_001027db;
    }
    plVar1 = __ptr;
  } while (__ptr + 0xf != (long *)pointer);
  if (plVar3 != (long *)0x0) {
    plVar2 = plVar3;
  }
  *plVar2 = *__ptr;
  if (((FILE *)this->m_Dumper != (FILE *)0x0 & this->m_Verbose) == 1) {
    fprintf((FILE *)this->m_Dumper,"Free: 0x%p (size %d[bytes]) allocated in: %s:%d\n",pointer,
            (ulong)*(uint *)(__ptr + 0xe),__ptr + 1,(ulong)*(uint *)((long)__ptr + 0x6c));
  }
LAB_001027db:
  free(__ptr);
  return;
}

Assistant:

void freeMemory(void* pointer, const char* file, int line) {

        if (pointer == NULL) {
            return;
        }

        // find the metadata record bucket in the hash table
        size_t hashIndex = MEMPLUMBER_HASH(pointer);
        new_ptr_list_t* metaDataBucketLinkedListElement = m_PointerListHashtable[hashIndex];
	    new_ptr_list_t* metaDataBucketLinkedListPrevElement = NULL;

        // inside the bucket, go over the linked list until you find the specific pointer
        while (metaDataBucketLinkedListElement != NULL) {

            // get the actual pointer from the record
            void* actualPointerInRecord = (char*)metaDataBucketLinkedListElement + sizeof(new_ptr_list_t);

            // if this is not the pointer we're looking for - continue the search
            if (actualPointerInRecord != pointer) {
                metaDataBucketLinkedListPrevElement = metaDataBucketLinkedListElement;
                metaDataBucketLinkedListElement = metaDataBucketLinkedListElement->next;
                continue;
            }
            else { // this is the pointer we're looking for

                // remove the current element from the linked list
                if (metaDataBucketLinkedListPrevElement == NULL) { // this is the first item in the list
                    m_PointerListHashtable[hashIndex] = metaDataBucketLinkedListElement->next;
                }
                else { // this is not the first item in the list
                    metaDataBucketLinkedListPrevElement->next = metaDataBucketLinkedListElement->next;
                }

                if (isVerbose()) {
                    fprintf(m_Dumper, "Free: 0x%p (size %d[bytes]) allocated in: %s:%d\n", 
                        pointer,
                        (int)metaDataBucketLinkedListElement->size,
                        metaDataBucketLinkedListElement->file, 
                        metaDataBucketLinkedListElement->line);
                }

                // free the memory of the current item
                free(metaDataBucketLinkedListElement);

                return;
            }
        }

        // if got to here it means memory was allocated before monitoring started. Simply free the memory and return 
        if (isVerbose()) {
            fprintf(m_Dumper, "Pointer 0x%p wasn't found\n", pointer);
        }

        free(pointer);
    }